

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O0

record * __thiscall record::operator=(record *this,record *r)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int32_t *piVar3;
  int local_1c;
  int i;
  record *r_local;
  record *this_local;
  
  if (this != r) {
    ~record(this);
    this->recordID = r->recordID;
    this->numFields = r->numFields;
    auVar1 = ZEXT116(this->numFields) * ZEXT816(4);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    piVar3 = (int32_t *)operator_new__(uVar2);
    this->fields = piVar3;
    for (local_1c = 0; local_1c < (int)(uint)this->numFields; local_1c = local_1c + 1) {
      this->fields[local_1c] = r->fields[local_1c];
    }
  }
  return this;
}

Assistant:

record &record::operator=(const record &r) {
    if(this != &r) {
        this->~record();

        recordID = r.recordID;
        numFields = r.numFields;

        fields = new int32_t[numFields];

        for (int i = 0; i < numFields; ++i) {
            fields[i] = r.fields[i];
        }
    }
    return *this;
}